

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

bool BicTest3<Blob<128>,Blob<256>>(pfHash hash,int reps,bool verbose)

{
  reference pvVar1;
  int iVar2;
  ulong uVar3;
  byte in_DL;
  int in_ESI;
  code *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool result;
  int i;
  double b2;
  int b_1;
  double bias;
  int *bins_1;
  int *page_1;
  int keybit_1;
  int out2_1;
  int out1_1;
  uint32_t x;
  int *b;
  int out2;
  int out1;
  Blob<256> d;
  int irep;
  int *page;
  int keybit;
  vector<int,_std::allocator<int>_> bins;
  Blob<256> h2;
  Blob<256> h1;
  Blob<128> key;
  int maxB;
  int maxA;
  int maxK;
  double maxBias;
  Rand r;
  int pagesize;
  int hashbits;
  int hashbytes;
  int keybits;
  int keybytes;
  uint32_t in_stack_fffffffffffffe9c;
  byte bVar6;
  uint32_t in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffea4;
  allocator_type *__a;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  Blob<256> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  double local_138;
  uint local_120;
  uint local_11c;
  uint local_118;
  int local_104;
  int local_100;
  int local_dc;
  int local_d0;
  allocator_type local_bd;
  undefined4 local_bc;
  vector<int,_std::allocator<int>_> local_b8;
  Blob<256> local_9c;
  Blob<256> local_7c;
  Blob<128> local_5c;
  uint local_4c;
  uint local_48;
  uint local_44;
  double local_40;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  byte local_d;
  int local_c;
  code *local_8;
  
  local_d = in_DL & 1;
  local_14 = 0x10;
  local_18 = 0x80;
  local_1c = 0x20;
  local_20 = 0x100;
  local_24 = 0x40000;
  local_c = in_ESI;
  local_8 = in_RDI;
  Rand::Rand((Rand *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe9c);
  local_40 = 0.0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  Blob<128>::Blob(&local_5c);
  Blob<256>::Blob(&local_7c);
  Blob<256>::Blob(&local_9c);
  local_bc = 0;
  __a = &local_bd;
  std::allocator<int>::allocator((allocator<int> *)0x1a126b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (size_type)in_stack_fffffffffffffeb8,
             (value_type_conflict *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             __a);
  std::allocator<int>::~allocator((allocator<int> *)0x1a1299);
  for (local_d0 = 0; local_d0 < 0x80; local_d0 = local_d0 + 1) {
    if (local_d0 % 0xc == 0) {
      printf(".");
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)(local_d0 << 0x12));
    for (local_dc = 0; local_dc < local_c; local_dc = local_dc + 1) {
      Rand::rand_p((Rand *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      (*local_8)(&local_5c,0x10,0,&local_7c);
      flipbit<Blob<128>>((Blob<128> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         in_stack_fffffffffffffe9c);
      (*local_8)(&local_5c,0x10,0,&local_9c);
      Blob<256>::operator^
                (in_stack_fffffffffffffeb8,
                 (Blob<256> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      for (local_100 = 0; local_104 = local_100, local_100 < 0xff; local_100 = local_100 + 1) {
        while (local_104 = local_104 + 1, local_104 < 0x100) {
          iVar2 = local_100 * 0x100 + local_104;
          in_stack_fffffffffffffea4 =
               getbit<Blob<256>>((Blob<256> *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 in_stack_fffffffffffffe9c);
          in_stack_fffffffffffffea0 =
               getbit<Blob<256>>((Blob<256> *)
                                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                 in_stack_fffffffffffffe9c);
          uVar3 = (ulong)(in_stack_fffffffffffffea4 | in_stack_fffffffffffffea0 << 1);
          pvVar1[(long)(iVar2 * 4) + uVar3] = pvVar1[(long)(iVar2 * 4) + uVar3] + 1;
        }
      }
    }
  }
  printf("\n");
  for (local_118 = 0; local_11c = local_118, (int)local_118 < 0xff; local_118 = local_118 + 1) {
    while (local_11c = local_11c + 1, (int)local_11c < 0x100) {
      if ((local_d & 1) != 0) {
        printf("(%3d,%3d) - ",(ulong)local_118,(ulong)local_11c);
      }
      for (local_120 = 0; (int)local_120 < 0x80; local_120 = local_120 + 1) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_b8,(long)(int)(local_120 << 0x12));
        local_138 = 0.0;
        for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (double)pvVar1[(long)(int)((local_118 * 0x100 + local_11c) * 4) +
                                        (long)iVar2] / (double)(local_c / 2);
          auVar4 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar4,ZEXT816(0xbff0000000000000));
          auVar5._8_8_ = 0x7fffffffffffffff;
          auVar5._0_8_ = 0x7fffffffffffffff;
          auVar4 = vpand_avx(auVar4,auVar5);
          if (local_138 < auVar4._0_8_) {
            local_138 = auVar4._0_8_;
          }
        }
        if (local_40 < local_138) {
          local_40 = local_138;
          local_44 = local_120;
          local_48 = local_118;
          local_4c = local_11c;
        }
        if ((local_d & 1) != 0) {
          if (0.01 <= local_138) {
            if (0.05 <= local_138) {
              if (0.33 <= local_138) {
                printf("X");
              }
              else {
                printf("O");
              }
            }
            else {
              printf("o");
            }
          }
          else {
            printf(".");
          }
        }
      }
      if ((local_d & 1) != 0) {
        printf("\n");
      }
    }
    if ((local_d & 1) != 0) {
      for (in_stack_fffffffffffffeb4 = 0; in_stack_fffffffffffffeb4 < 0x8c;
          in_stack_fffffffffffffeb4 = in_stack_fffffffffffffeb4 + 1) {
        printf("-");
      }
      printf("\n");
    }
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",local_40,(ulong)local_44,(ulong)local_48,(ulong)local_4c)
  ;
  bVar6 = local_40 < 0.05;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,CONCAT13(bVar6,(int3)in_stack_fffffffffffffeb0)));
  return (bool)(bVar6 & 1);
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}